

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O3

void __thiscall
libtorrent::resolver::async_resolve(resolver *this,string *host,resolver_flags flags,callback_t *h)

{
  function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
  *pfVar1;
  char *__s;
  long lVar2;
  long lVar3;
  io_service *piVar4;
  string *host_00;
  int iVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  char *pcVar9;
  iterator iVar10;
  time_point tVar11;
  long *plVar12;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *pcVar13;
  byte *pbVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  undefined4 uVar17;
  char *__cp;
  pointer pcVar18;
  size_t __n;
  bytes_type bytes;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> ips;
  query q;
  undefined1 local_138 [8];
  completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *pcStack_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Any_data local_108;
  _Manager_type local_f8;
  _Head_base<0UL,_libtorrent::resolver_*,_false> local_e8;
  string *local_e0;
  vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> local_d8;
  undefined1 local_b8 [24];
  sockaddr *local_a0;
  addrinfo *local_90;
  _Alloc_hider _Stack_88;
  undefined1 local_80 [8];
  address aStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  address *local_48;
  completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
  *pcStack_40;
  
  __s = (host->_M_dataplus)._M_p;
  local_e0 = host;
  piVar8 = __errno_location();
  *piVar8 = 0;
  pcVar9 = strchr(__s,0x25);
  __cp = __s;
  if (pcVar9 == (char *)0x0) {
LAB_00243b27:
    iVar5 = inet_pton(10,__cp,local_138);
    if (0 < iVar5) {
      iVar5 = *piVar8;
      if (pcVar9 == (char *)0x0) {
        pcVar18 = (pointer)0x0;
      }
      else if ((((local_138[0] == (string)0xfe) || (local_138[0] != (string)0xff)) ||
               ((local_138[1] & 0xf) != 2)) || (uVar6 = if_nametoindex(pcVar9 + 1), uVar6 == 0)) {
        iVar7 = atoi(pcVar9 + 1);
        pcVar18 = (pointer)(long)iVar7;
      }
      else {
        pcVar18 = (pointer)(ulong)uVar6;
      }
      local_d8.
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_138;
      local_d8.
      super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)pcStack_130;
      if (iVar5 == 0) {
        local_48 = (address *)local_138;
        pcStack_40 = pcStack_130;
        iVar5 = 0;
        uVar17 = 1;
        goto LAB_00243db2;
      }
    }
  }
  else {
    __n = (long)pcVar9 - (long)__s;
    if ((long)__n < 0x40) {
      __cp = local_b8;
      memcpy(__cp,__s,__n);
      local_b8[__n] = 0;
      goto LAB_00243b27;
    }
  }
  *piVar8 = 0;
  iVar5 = inet_pton(2,__s,local_b8);
  host_00 = local_e0;
  if ((0 < iVar5) && (*piVar8 == 0)) {
    local_48 = (address *)0x0;
    pcStack_40 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                  *)0x0;
    uVar17 = 0;
    pcVar18 = (pointer)0x0;
    iVar5 = local_b8._0_4_;
LAB_00243db2:
    piVar4 = this->m_ios;
    pfVar1 = (function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
              *)(local_b8 + 8);
    local_b8._0_8_ = this;
    std::
    function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
    ::function(pfVar1,h);
    local_90 = (addrinfo *)0x0;
    _Stack_88._M_p = (pointer)&boost::system::detail::cat_holder<void>::system_category_instance;
    local_80._4_4_ = iVar5;
    local_80._0_4_ = uVar17;
    aStack_78._0_8_ = local_48;
    aStack_78.ipv6_address_.addr_.__in6_u._0_8_ = pcStack_40;
    local_138 = (undefined1  [8])local_b8;
    aStack_78.ipv6_address_.addr_.__in6_u._8_8_ = pcVar18;
    plVar12 = (long *)__tls_get_addr(&PTR_00462f10);
    if (*plVar12 == 0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(undefined8 *)(*plVar12 + 8);
    }
    pcVar13 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
               *)boost::asio::detail::thread_info_base::
                 allocate<boost::asio::detail::thread_info_base::default_tag>(uVar15,0x78);
    local_128._M_allocated_capacity = 0;
    (pcVar13->super_operation).next_ = (scheduler_operation *)0x0;
    (pcVar13->super_operation).func_ =
         boost::asio::detail::
         completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
         ::do_complete;
    (pcVar13->super_operation).task_result_ = 0;
    (pcVar13->handler_).this = (resolver *)local_b8._0_8_;
    pcStack_130 = pcVar13;
    std::
    function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
    ::function(&(pcVar13->handler_).h,pfVar1);
    *(addrinfo **)&(pcVar13->handler_).ec = local_90;
    (pcVar13->handler_).ec.cat_ = (error_category *)_Stack_88._M_p;
    (pcVar13->handler_).ip.type_ = local_80._0_4_;
    (pcVar13->handler_).ip.ipv4_address_ = (address_v4)local_80._4_4_;
    *(undefined8 *)&(pcVar13->handler_).ip.ipv6_address_.addr_.__in6_u = aStack_78._0_8_;
    *(undefined8 *)((long)&(pcVar13->handler_).ip.ipv6_address_.addr_.__in6_u + 8) =
         aStack_78.ipv6_address_.addr_.__in6_u._0_8_;
    (pcVar13->handler_).ip.ipv6_address_.scope_id_ = aStack_78.ipv6_address_.addr_.__in6_u._8_8_;
    local_128._M_allocated_capacity = (size_type)pcVar13;
    boost::asio::detail::scheduler::post_immediate_completion
              (piVar4->impl_,(operation *)pcVar13,false);
    pcStack_130 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                   *)0x0;
    local_128._M_allocated_capacity = 0;
    boost::asio::detail::
    completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
    ::ptr::reset((ptr *)local_138);
    if (local_a0 != (sockaddr *)0x0) {
      (*(code *)local_a0)(pfVar1,pfVar1,3);
    }
    return;
  }
  local_48 = (address *)0x0;
  pcStack_40 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                *)0x0;
  iVar10 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->m_cache)._M_h,local_e0);
  local_138 = (undefined1  [8])local_b8;
  if (iVar10.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
      ._M_cur == (__node_type *)0x0) {
    if ((flags.m_val & 1) != 0) {
      piVar4 = this->m_ios;
      pfVar1 = (function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
                *)(local_b8 + 8);
      local_b8._0_8_ = this;
      std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function(pfVar1,h);
      plVar12 = (long *)__tls_get_addr(&PTR_00462f10);
      if (*plVar12 == 0) {
        uVar15 = 0;
      }
      else {
        uVar15 = *(undefined8 *)(*plVar12 + 8);
      }
      pcVar13 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                 *)boost::asio::detail::thread_info_base::
                   allocate<boost::asio::detail::thread_info_base::default_tag>(uVar15,0x48);
      local_128._M_allocated_capacity = 0;
      (pcVar13->super_operation).next_ = (scheduler_operation *)0x0;
      (pcVar13->super_operation).func_ =
           boost::asio::detail::
           completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:129:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
           ::do_complete;
      (pcVar13->super_operation).task_result_ = 0;
      (pcVar13->handler_).this = (resolver *)local_b8._0_8_;
      pcStack_130 = pcVar13;
      std::
      function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
      ::function(&(pcVar13->handler_).h,pfVar1);
      local_128._M_allocated_capacity = (size_type)pcVar13;
      boost::asio::detail::scheduler::post_immediate_completion
                (piVar4->impl_,(operation *)pcVar13,false);
      pcStack_130 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                     *)0x0;
      local_128._M_allocated_capacity = 0;
      boost::asio::detail::
      completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:129:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
      ::ptr::reset((ptr *)local_138);
      if (local_a0 == (sockaddr *)0x0) {
        return;
      }
      (*(code *)local_a0)(pfVar1,pfVar1,3);
      return;
    }
  }
  else if (((flags.m_val & 1) != 0) ||
          (lVar2 = (this->m_timeout).__r,
          lVar3 = *(long *)((long)iVar10.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                                  ._M_cur + 0x28), tVar11 = aux::time_now(),
          (long)tVar11.__d.__r <= lVar2 + lVar3)) {
    std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
              (&local_d8,
               (vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
               ((long)iVar10.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::resolver::dns_cache_entry>,_true>
                      ._M_cur + 0x30));
    piVar4 = this->m_ios;
    pfVar1 = (function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
              *)(local_b8 + 8);
    local_b8._0_8_ = this;
    std::
    function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
    ::function(pfVar1,h);
    local_90 = (addrinfo *)0x0;
    _Stack_88._M_p = (pointer)&boost::system::detail::cat_holder<void>::system_category_instance;
    std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>::vector
              ((vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_> *)
               local_80,&local_d8);
    plVar12 = (long *)__tls_get_addr(&PTR_00462f10);
    if (*plVar12 == 0) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(undefined8 *)(*plVar12 + 8);
    }
    pcVar13 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
               *)boost::asio::detail::thread_info_base::
                 allocate<boost::asio::detail::thread_info_base::default_tag>(uVar15,0x70);
    local_128._M_allocated_capacity = 0;
    (pcVar13->super_operation).next_ = (scheduler_operation *)0x0;
    (pcVar13->super_operation).func_ =
         boost::asio::detail::
         completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:121:16),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
         ::do_complete;
    (pcVar13->super_operation).task_result_ = 0;
    (pcVar13->handler_).this = (resolver *)local_b8._0_8_;
    pcStack_130 = pcVar13;
    std::
    function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>
    ::function(&(pcVar13->handler_).h,pfVar1);
    *(addrinfo **)&(pcVar13->handler_).ec = local_90;
    (pcVar13->handler_).ec.cat_ = (error_category *)_Stack_88._M_p;
    (pcVar13->handler_).ip.type_ = local_80._0_4_;
    (pcVar13->handler_).ip.ipv4_address_ = (address_v4)local_80._4_4_;
    *(undefined8 *)&(pcVar13->handler_).ip.ipv6_address_.addr_.__in6_u = aStack_78._0_8_;
    *(undefined8 *)((long)&(pcVar13->handler_).ip.ipv6_address_.addr_.__in6_u + 8) =
         aStack_78.ipv6_address_.addr_.__in6_u._0_8_;
    local_80 = (undefined1  [8])0x0;
    aStack_78._0_8_ = (pointer)0x0;
    aStack_78.ipv6_address_.addr_.__in6_u._0_8_ = (pointer)0x0;
    local_128._M_allocated_capacity = (size_type)pcVar13;
    boost::asio::detail::scheduler::post_immediate_completion
              (piVar4->impl_,(operation *)pcVar13,false);
    pcStack_130 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                   *)0x0;
    local_128._M_allocated_capacity = 0;
    boost::asio::detail::
    completion_handler<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/duality-solutions[P]libbdaptorrent/src/resolver.cpp:121:16),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
    ::ptr::reset((ptr *)local_138);
    if (local_80 != (undefined1  [8])0x0) {
      operator_delete((void *)local_80,aStack_78.ipv6_address_.addr_.__in6_u._0_8_ - (long)local_80)
      ;
    }
    if (local_a0 != (sockaddr *)0x0) {
      (*(code *)local_a0)(pfVar1,pfVar1,3);
    }
    if (local_d8.
        super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>.
        _M_impl.super__Vector_impl_data._M_start == (address *)0x0) {
      return;
    }
    pbVar14 = (byte *)((long)local_d8.
                             super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_d8.
                            super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    _Var16._M_p = (pointer)local_d8.
                           super__Vector_base<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_002440cf;
  }
  local_138 = (undefined1  [8])&local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"80","");
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_b8,host_00,(string *)local_138,
             address_configured);
  if (local_138 != (undefined1  [8])&local_128) {
    operator_delete((void *)local_138,local_128._M_allocated_capacity + 1);
  }
  local_e8._M_head_impl = this;
  if ((flags.m_val & 2) == 0) {
    local_138 = (undefined1  [8])on_lookup;
    pcStack_130 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                   *)0x0;
    std::
    _Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Tuple_impl((_Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_128,h,host_00);
    boost::asio::detail::resolver_service<boost::asio::ip::tcp>::
    async_resolve<std::_Bind<void(libtorrent::resolver::*(libtorrent::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              ((this->m_critical_resolver).impl_.service_,
               &(this->m_critical_resolver).impl_.implementation_,(query_type *)local_b8,
               (_Bind<void_(libtorrent::resolver::*(libtorrent::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_const_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)local_138,&(this->m_critical_resolver).impl_.executor_);
    if (local_f8 != (_Manager_type)0x0) {
      (*local_f8)(&local_108,&local_108,__destroy_functor);
    }
  }
  else {
    local_138 = (undefined1  [8])on_lookup;
    pcStack_130 = (completion_handler<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_duality_solutions[P]libbdaptorrent_src_resolver_cpp:108:15),_boost::asio::io_context::basic_executor_type<std::allocator<void>,_0U>_>
                   *)0x0;
    std::
    _Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Tuple_impl((_Tuple_impl<3UL,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_128,h,host_00);
    boost::asio::detail::resolver_service<boost::asio::ip::tcp>::
    async_resolve<std::_Bind<void(libtorrent::resolver::*(libtorrent::resolver*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>,std::__cxx11::string))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&,std::vector<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&)>const&,std::__cxx11::string_const&)>,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              ((this->m_resolver).impl_.service_,&(this->m_resolver).impl_.implementation_,
               (query_type *)local_b8,
               (_Bind<void_(libtorrent::resolver::*(libtorrent::resolver_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_const_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)local_138,&(this->m_resolver).impl_.executor_);
    if (local_f8 != (_Manager_type)0x0) {
      (*local_f8)(&local_108,&local_108,__destroy_functor);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_allocated_capacity != &local_118) {
    operator_delete((void *)local_128._M_allocated_capacity,local_118._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)aStack_78.ipv6_address_.addr_.__in6_u._8_8_ != &local_58) {
    operator_delete((void *)aStack_78.ipv6_address_.addr_.__in6_u._8_8_,
                    local_58._M_allocated_capacity + 1);
  }
  if ((address *)_Stack_88._M_p == &aStack_78) {
    return;
  }
  pbVar14 = (byte *)(aStack_78._0_8_ + 1);
  _Var16._M_p = _Stack_88._M_p;
LAB_002440cf:
  operator_delete(_Var16._M_p,(ulong)pbVar14);
  return;
}

Assistant:

void resolver::async_resolve(std::string const& host, resolver_flags const flags
		, resolver_interface::callback_t const& h)
	{
		// special handling for raw IP addresses. There's no need to get in line
		// behind actual lookups if we can just resolve it immediately.
		error_code ec;
		address const ip = make_address(host, ec);
		if (!ec)
		{
			m_ios.post([=]{ callback(h, ec, std::vector<address>{ip}); });
			return;
		}
		ec.clear();

		auto const i = m_cache.find(host);
		if (i != m_cache.end())
		{
			// keep cache entries valid for m_timeout seconds
			if ((flags & resolver_interface::cache_only)
				|| i->second.last_seen + m_timeout >= aux::time_now())
			{
				std::vector<address> ips = i->second.addresses;
				m_ios.post([=] { callback(h, ec, ips); });
				return;
			}
		}

		if (flags & resolver_interface::cache_only)
		{
			// we did not find a cache entry, fail the lookup
			m_ios.post([=] {
				callback(h, boost::asio::error::host_not_found, std::vector<address>{});
			});
			return;
		}

		// the port is ignored
		tcp::resolver::query const q(host, "80");

		using namespace std::placeholders;
		ADD_OUTSTANDING_ASYNC("resolver::on_lookup");
		if (flags & resolver_interface::abort_on_shutdown)
		{
			m_resolver.async_resolve(q, std::bind(&resolver::on_lookup, this, _1, _2
				, h, host));
		}
		else
		{
			m_critical_resolver.async_resolve(q, std::bind(&resolver::on_lookup, this, _1, _2
				, h, host));
		}
	}